

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall cnn::LookupParameters::LookupParameters(LookupParameters *this,uint n,Dim *d)

{
  undefined8 *puVar1;
  pointer pTVar2;
  ulong __n;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  AlignedMemoryPool *pAVar6;
  uint uVar7;
  void *pvVar8;
  long lVar9;
  allocator_type local_4a;
  allocator_type local_49;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_48;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *local_40;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *local_38;
  
  (this->super_ParametersBase)._vptr_ParametersBase = (_func_int **)&PTR_scale_parameters_003a3350;
  uVar3 = *(undefined8 *)(d->d + 2);
  uVar4 = *(undefined8 *)(d->d + 4);
  uVar5 = *(undefined8 *)(d->d + 6);
  *(undefined8 *)(this->dim).d = *(undefined8 *)d->d;
  *(undefined8 *)((this->dim).d + 2) = uVar3;
  *(undefined8 *)((this->dim).d + 4) = uVar4;
  *(undefined8 *)((this->dim).d + 6) = uVar5;
  (this->dim).bd = d->bd;
  local_38 = &this->values;
  __n = (ulong)n;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(local_38,__n,&local_49);
  local_40 = &this->grads;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(local_40,__n,&local_4a);
  local_48 = &this->non_zero_grads;
  (this->non_zero_grads)._M_h._M_buckets = &(this->non_zero_grads)._M_h._M_single_bucket;
  (this->non_zero_grads)._M_h._M_bucket_count = 1;
  (this->non_zero_grads)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->non_zero_grads)._M_h._M_element_count = 0;
  (this->non_zero_grads)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->non_zero_grads)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->non_zero_grads)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (lVar9 = 0; __n * 0x48 - lVar9 != 0; lVar9 = lVar9 + 0x48) {
    pTVar2 = (local_38->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(uint *)((long)(pTVar2->d).d + lVar9 + 0x20) = d->bd;
    uVar3 = *(undefined8 *)d->d;
    uVar4 = *(undefined8 *)(d->d + 2);
    uVar5 = *(undefined8 *)(d->d + 6);
    puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar9 + 0x10);
    *puVar1 = *(undefined8 *)(d->d + 4);
    puVar1[1] = uVar5;
    puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar9);
    *puVar1 = uVar3;
    puVar1[1] = uVar4;
    pAVar6 = ps;
    uVar7 = Dim::size(d);
    pvVar8 = AlignedMemoryPool::allocate(pAVar6,(ulong)uVar7 << 2);
    *(void **)((long)(&pTVar2->d + 1) + lVar9 + 4) = pvVar8;
    TensorTools::Randomize((Tensor *)((long)(pTVar2->d).d + lVar9));
    pTVar2 = (local_40->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(uint *)((long)(pTVar2->d).d + lVar9 + 0x20) = d->bd;
    uVar3 = *(undefined8 *)d->d;
    uVar4 = *(undefined8 *)(d->d + 2);
    uVar5 = *(undefined8 *)(d->d + 6);
    puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar9 + 0x10);
    *puVar1 = *(undefined8 *)(d->d + 4);
    puVar1[1] = uVar5;
    puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar9);
    *puVar1 = uVar3;
    puVar1[1] = uVar4;
    pAVar6 = ps;
    uVar7 = Dim::size(d);
    pvVar8 = AlignedMemoryPool::allocate(pAVar6,(ulong)uVar7 << 2);
    *(void **)((long)(&pTVar2->d + 1) + lVar9 + 4) = pvVar8;
    TensorTools::Zero((Tensor *)((long)(pTVar2->d).d + lVar9));
  }
  return;
}

Assistant:

LookupParameters::LookupParameters(unsigned n, const Dim& d) : dim(d), values(n), grads(n) {
  for (unsigned i = 0; i < n; ++i) {
    auto& v = values[i];
    v.d = d;
    v.v = static_cast<float*>(ps->allocate(d.size() * sizeof(float)));
    TensorTools::Randomize(v);

    auto& g = grads[i];
    g.d = d;
    g.v = static_cast<float*>(ps->allocate(d.size() * sizeof(float)));
    TensorTools::Zero(g);
  }
}